

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O3

void jpeg_stdio_src(j_decompress_ptr cinfo,FILE *infile)

{
  jpeg_error_mgr *pjVar1;
  jpeg_source_mgr *pjVar2;
  void *pvVar3;
  
  if (cinfo->src == (jpeg_source_mgr *)0x0) {
    pjVar2 = (jpeg_source_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x50);
    cinfo->src = pjVar2;
    pvVar3 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x1000);
    pjVar2[1].bytes_in_buffer = (size_t)pvVar3;
  }
  else if (cinfo->src->init_source != init_source) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x17;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  pjVar2 = cinfo->src;
  pjVar2->init_source = init_source;
  pjVar2->fill_input_buffer = fill_input_buffer;
  pjVar2->skip_input_data = skip_input_data;
  pjVar2->resync_to_restart = jpeg_resync_to_restart;
  pjVar2->term_source = term_source;
  pjVar2[1].next_input_byte = (JOCTET *)infile;
  pjVar2->next_input_byte = (JOCTET *)0x0;
  pjVar2->bytes_in_buffer = 0;
  return;
}

Assistant:

GLOBAL(void)
jpeg_stdio_src(j_decompress_ptr cinfo, FILE *infile)
{
  my_src_ptr src;

  /* The source object and input buffer are made permanent so that a series
   * of JPEG images can be read from the same file by calling jpeg_stdio_src
   * only before the first one.  (If we discarded the buffer at the end of
   * one image, we'd likely lose the start of the next one.)
   */
  if (cinfo->src == NULL) {     /* first time for this JPEG object? */
    cinfo->src = (struct jpeg_source_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  sizeof(my_source_mgr));
    src = (my_src_ptr)cinfo->src;
    src->buffer = (JOCTET *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  INPUT_BUF_SIZE * sizeof(JOCTET));
  } else if (cinfo->src->init_source != init_source) {
    /* It is unsafe to reuse the existing source manager unless it was created
     * by this function.  Otherwise, there is no guarantee that the opaque
     * structure is the right size.  Note that we could just create a new
     * structure, but the old structure would not be freed until
     * jpeg_destroy_decompress() was called.
     */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  src = (my_src_ptr)cinfo->src;
  src->pub.init_source = init_source;
  src->pub.fill_input_buffer = fill_input_buffer;
  src->pub.skip_input_data = skip_input_data;
  src->pub.resync_to_restart = jpeg_resync_to_restart; /* use default method */
  src->pub.term_source = term_source;
  src->infile = infile;
  src->pub.bytes_in_buffer = 0; /* forces fill_input_buffer on first read */
  src->pub.next_input_byte = NULL; /* until buffer loaded */
}